

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_scalingFactorWithOneEmptyUnit_Test::TestBody(Units_scalingFactorWithOneEmptyUnit_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  UnitsPtr u2;
  UnitsPtr u1;
  long *local_68;
  double local_60;
  long *local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  long local_48 [2];
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  string *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Units::create();
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"u1","");
  libcellml::NamedEntity::setName(local_28);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_38;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"u2","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  pcVar3 = "";
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"","");
  libcellml::Units::addUnit((StandardUnit)local_38,0xe,1.0,1.0,(string *)0x0);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  local_68 = (long *)0x0;
  local_60 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_28,(shared_ptr *)&local_38,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_58,"0.0","libcellml::Units::scalingFactor(u1, u2)",
             (double *)&local_68,&local_60);
  if (local_58._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x470,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if (local_68 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_68 != (long *)0x0)) {
        (**(code **)(*local_68 + 8))();
      }
      local_68 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68 = (long *)0x0;
  local_60 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_38,(shared_ptr *)&local_28,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_58,"0.0","libcellml::Units::scalingFactor(u2, u1)",
             (double *)&local_68,&local_60);
  if (local_58._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x471,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if (local_68 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_68 != (long *)0x0)) {
        (**(code **)(*local_68 + 8))();
      }
      local_68 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Units, scalingFactorWithOneEmptyUnit)
{
    // Add unit with no members
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::LITRE, 0, 1.0, 1.0);

    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}